

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus DecodeFMem(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  int32_t iVar1;
  uint32_t uVar2;
  uint Reg_00;
  uint Reg_01;
  uint in_ESI;
  MCInst *in_RDI;
  uint Base;
  uint Reg;
  int Offset;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  
  iVar1 = SignExtend32(in_ESI & 0xffff,0x10);
  fieldFromInstruction(in_ESI,0x10,5);
  uVar2 = fieldFromInstruction(in_ESI,0x15,5);
  Reg_00 = getReg((MCRegisterInfo *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  Reg_01 = getReg((MCRegisterInfo *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  MCOperand_CreateReg0(in_RDI,Reg_00);
  MCOperand_CreateReg0(in_RDI,Reg_01);
  MCOperand_CreateImm0(in_RDI,(long)iVar1);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeFMem(MCInst *Inst,
		unsigned Insn, uint64_t Address, const MCRegisterInfo *Decoder)
{
	int Offset = SignExtend32(Insn & 0xffff, 16);
	unsigned Reg = fieldFromInstruction(Insn, 16, 5);
	unsigned Base = fieldFromInstruction(Insn, 21, 5);

	Reg = getReg(Decoder, Mips_FGR64RegClassID, Reg);
	Base = getReg(Decoder, Mips_GPR32RegClassID, Base);

	MCOperand_CreateReg0(Inst, Reg);
	MCOperand_CreateReg0(Inst, Base);
	MCOperand_CreateImm0(Inst, Offset);

	return MCDisassembler_Success;
}